

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O1

uint32_t Ngram_next_words(Ngram model,uint32_t *context,uint32_t context_len,
                         uint32_t next_word_limit,NextWordResult_T *rets)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  LowGram_T *pLVar4;
  HighGram_T *pHVar5;
  bool bVar6;
  ulong uVar7;
  NextWordResult_T *__base;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  ulong uVar17;
  bool bVar18;
  
  if (context_len == 0) {
    next_word_limit = 0;
  }
  else {
    uVar12 = (ulong)((context_len - model->ngram_order) + 1);
    uVar10 = 0;
    if (context_len < model->ngram_order) {
      uVar12 = 0;
    }
    uVar7 = uVar12;
    if ((uint)uVar12 <= context_len) {
      uVar7 = (ulong)context_len;
    }
    do {
      if (uVar12 == uVar7) {
        return uVar10;
      }
      puVar1 = context + uVar12;
      uVar12 = uVar12 + 1;
      uVar15 = model->uni_gram[*puVar1 + 1].next_arr_idx;
      uVar16 = model->uni_gram[*puVar1].next_arr_idx;
      uVar17 = 0;
      if (uVar12 < context_len) {
        uVar9 = uVar12 & 0xffffffff;
        uVar17 = 0;
        do {
          uVar8 = 0xffffffff;
          if (uVar15 - uVar16 != 0) {
            uVar2 = context[uVar9];
            lVar11 = (ulong)(uVar15 - uVar16) - 1;
            lVar14 = 0;
            do {
              uVar13 = (ulong)(lVar14 + lVar11) >> 1;
              uVar3 = model->low_grams[uVar17][uVar16 + uVar13].word;
              if (uVar3 == uVar2) {
                uVar8 = (uint)uVar13;
                break;
              }
              if (uVar3 < uVar2 || uVar3 == uVar2) {
                lVar14 = uVar13 + 1;
              }
              else {
                lVar11 = uVar13 - 1;
              }
            } while (lVar14 <= lVar11);
          }
          uVar17 = uVar17 + 1;
          bVar18 = uVar8 == 0xffffffff;
          if (bVar18) break;
          pLVar4 = model->low_grams[uVar17 & 0xffffffff];
          uVar9 = uVar9 + 1;
          uVar16 = pLVar4[uVar8].next_arr_idx;
          uVar15 = pLVar4[(ulong)uVar8 + 1].next_arr_idx;
        } while (uVar9 < context_len);
      }
      else {
        bVar18 = true;
      }
      bVar6 = true;
      if (!bVar18) {
        uVar9 = (ulong)(uVar15 - uVar16);
        __base = (NextWordResult_T *)malloc(uVar9 * 8);
        if ((int)uVar17 + 2U == model->ngram_order) {
          if (uVar15 == uVar16) {
LAB_00102b98:
            uVar17 = 0;
          }
          else {
            pHVar5 = model->high_gram;
            lVar11 = 0;
            uVar17 = 0;
            do {
              uVar15 = pHVar5[(ulong)uVar16 + lVar11].prob;
              if (uVar15 != 0xffffffff) {
                __base[uVar17].word_id = pHVar5[(ulong)uVar16 + lVar11].word;
                __base[uVar17].prob = uVar15;
                uVar17 = uVar17 + 1;
              }
              lVar11 = lVar11 + 1;
            } while (uVar9 + (uVar9 == 0) != lVar11);
          }
        }
        else {
          if (uVar15 == uVar16) goto LAB_00102b98;
          pLVar4 = model->low_grams[uVar17 & 0xffffffff];
          lVar11 = 0;
          uVar17 = 0;
          do {
            uVar15 = *(uint32_t *)((long)&pLVar4[uVar16].prob + lVar11);
            if (uVar15 != 0xffffffff) {
              __base[uVar17].word_id = *(uint32_t *)((long)&pLVar4[uVar16].word + lVar11);
              __base[uVar17].prob = uVar15;
              uVar17 = uVar17 + 1;
            }
            lVar11 = lVar11 + 0x10;
          } while ((uVar9 + (uVar9 == 0)) * 0x10 != lVar11);
        }
        qsort(__base,uVar17,8,next_word_cmp);
        bVar18 = uVar17 != 0;
        if (bVar18) {
          uVar9 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          rets[uVar9] = *__base;
          if (uVar10 < next_word_limit) {
            uVar9 = 0;
            do {
              if (uVar17 - 1 == uVar9) {
                uVar10 = uVar10 + (int)uVar9;
                bVar18 = false;
                goto LAB_00102c79;
              }
              uVar13 = uVar9 + 1;
              rets[uVar10 + uVar9] = __base[uVar9 + 1];
              uVar9 = uVar13;
            } while (uVar10 + (int)uVar13 < next_word_limit);
            bVar18 = uVar13 < uVar17;
            uVar10 = uVar10 + (int)uVar13;
          }
          free(__base);
        }
LAB_00102c79:
        if (bVar18) {
          bVar6 = false;
        }
        else {
          free(__base);
          bVar6 = true;
        }
      }
    } while (bVar6);
  }
  return next_word_limit;
}

Assistant:

uint32_t Ngram_next_words(const Ngram model, const uint32_t* context, uint32_t context_len, uint32_t next_word_limit, NextWordResult_T* rets){
    if (context_len == 0) {
        return 0;
    }
    uint32_t start = (context_len >= model->ngram_order) ? (context_len - model->ngram_order + 1): 0;
    uint32_t res_num = 0;
    for (uint32_t i = start; i < context_len; i++) {
        uint32_t cur_word_id = context[i];
        uint32_t next_word_start = model->uni_gram[cur_word_id].next_arr_idx;
        uint32_t next_word_end = model->uni_gram[cur_word_id+1].next_arr_idx;
        uint32_t next = -1;
        uint32_t ngram_idx = 0;
        for (uint32_t j = i+1; j < context_len;j++) {
            next = search_low_gram(context[j], model->low_grams[ngram_idx] + next_word_start, next_word_end - next_word_start);
            ngram_idx+=1;
            if (next == -1) {
                break;
            }else{
                next_word_start = model->low_grams[ngram_idx][next].next_arr_idx;
                next_word_end = model->low_grams[ngram_idx][next+1].next_arr_idx;
            }
        }
        if (next != -1) {
            //have found
            size_t arr_size = next_word_end - next_word_start;
            size_t arr_real_size = 0;
            NextWordResult_T* word_results = malloc(sizeof(NextWordResult_T)*arr_size);
            if (ngram_idx+2 != model->ngram_order) {
                //in low gram array
                for (size_t i = 0; i < arr_size; i++) {
                    LowGram_T* gram = &model->low_grams[ngram_idx][next_word_start+i];
                    if (gram->prob != (uint32_t)-1) {//srilm's bug
                        word_results[arr_real_size].word_id = gram->word; 
                        word_results[arr_real_size].prob = gram->prob;
                        arr_real_size++;
                    }
                }
            }else{
                //in high gram array
                for (size_t i = 0; i < arr_size; i++) {
                    HighGram_T* gram = &model->high_gram[next_word_start+i];
                    if (gram->prob != (uint32_t)-1) {
                        word_results[arr_real_size].word_id = gram->word; 
                        word_results[arr_real_size].prob = gram->prob;
                        arr_real_size++;
                    }
                }
            }
            qsort(word_results,arr_real_size, sizeof(NextWordResult_T), next_word_cmp);
            //copy to dst
            //if enough, then break
            for (size_t i = 0;i< arr_real_size;i++) {
                rets[res_num++] = word_results[i];
                if (res_num >= next_word_limit) {
                    free(word_results);
                    return next_word_limit;
                }
            }
            free(word_results);
        }
    }
    return res_num;
}